

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_local_value.hpp
# Opt level: O2

long __thiscall
ylt::metric::thread_local_value<long>::update(thread_local_value<long> *this,long value)

{
  atomic<long> aVar1;
  pointer paVar2;
  __base_type _Var3;
  size_t i;
  atomic<long> *paVar4;
  ulong uVar5;
  __int_type _Var6;
  
  paVar4 = get_value(this,0);
  LOCK();
  _Var6 = (paVar4->super___atomic_base<long>)._M_i;
  (paVar4->super___atomic_base<long>)._M_i = value;
  UNLOCK();
  for (uVar5 = 1;
      paVar2 = (this->duplicates_).
               super__Vector_base<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->duplicates_).
                            super__Vector_base<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)paVar2 >> 3);
      uVar5 = uVar5 + 1) {
    if (paVar2[uVar5]._M_b._M_p != (__pointer_type)0x0) {
      _Var3._M_p = (this->duplicates_).
                   super__Vector_base<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar5]._M_b._M_p;
      LOCK();
      aVar1.super___atomic_base<long>._M_i = (_Var3._M_p)->super___atomic_base<long>;
      (_Var3._M_p)->super___atomic_base<long> = (__atomic_base<long>)0x0;
      UNLOCK();
      _Var6 = _Var6 + (long)aVar1.super___atomic_base<long>._M_i;
    }
  }
  return _Var6;
}

Assistant:

value_type update(value_type value = 1) {
    value_type val = get_value(0).exchange(value, std::memory_order::relaxed);
    for (size_t i = 1; i < duplicates_.size(); i++) {
      if (duplicates_[i]) {
        val += duplicates_[i].load()->exchange(0, std::memory_order::relaxed);
      }
    }
    return val;
  }